

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::computeVertexReference
          (ShaderRenderCaseInstance *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float *pfVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int x;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vec4 c00;
  Vec4 color;
  Vec4 c11;
  ShaderEvalContext evalCtx;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  RGBA local_37c;
  undefined1 local_378 [16];
  undefined8 local_368;
  undefined8 uStack_360;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_350;
  ulong local_338;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  Vec4 local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ShaderEvalContext local_2a0;
  
  iVar1 = result->m_width;
  iVar12 = result->m_height;
  uVar2 = quadGrid->m_gridSize;
  uVar11 = uVar2 + 1;
  ShaderEvalContext::ShaderEvalContext(&local_2a0,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_350,(long)(int)(uVar11 * uVar11),(allocator_type *)&local_318);
  if ((ulong)uVar2 < 0x7fffffff) {
    lVar13 = 0;
    uVar16 = 0;
    do {
      local_378._0_8_ = uVar16;
      local_368 = CONCAT44(local_368._4_4_,(float)(int)uVar16 / (float)(int)uVar2);
      uVar16 = 0;
      do {
        ShaderEvalContext::reset(&local_2a0,(float)(int)uVar16 / (float)(int)uVar2,(float)local_368)
        ;
        (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&local_2a0);
        *(undefined8 *)
         local_350.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start[(int)uVar16 + (int)lVar13].m_data =
             local_2a0.color.m_data._0_8_;
        *(undefined8 *)
         (local_350.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start[(int)uVar16 + (int)lVar13].m_data + 2) =
             local_2a0.color.m_data._8_8_;
        uVar16 = uVar16 + 1;
      } while (uVar11 != uVar16);
      uVar16 = (ulong)(local_378._0_4_ + 1);
      lVar13 = lVar13 + (ulong)uVar11;
    } while (local_378._0_4_ != uVar2);
  }
  if (0 < (int)uVar2) {
    local_308 = (float)(int)uVar2;
    local_2e8 = ZEXT416((uint)local_308);
    local_2f8 = (float)iVar12;
    uVar16 = 0;
    fStack_304 = local_308;
    fStack_300 = local_308;
    fStack_2fc = local_308;
    fStack_2f4 = local_2f8;
    fStack_2f0 = local_2f8;
    fStack_2ec = local_2f8;
    do {
      iVar12 = (int)uVar16;
      uVar14 = iVar12 + 1;
      auVar26._0_4_ = (float)iVar12;
      auVar26._4_4_ = (float)(int)uVar14;
      auVar26._8_8_ = 0;
      auVar27._4_4_ = fStack_304;
      auVar27._0_4_ = local_308;
      auVar27._8_4_ = fStack_300;
      auVar27._12_4_ = fStack_2fc;
      auVar27 = divps(auVar26,auVar27);
      local_2d8 = auVar27._0_4_ * local_2f8;
      fStack_2d4 = auVar27._4_4_ * fStack_2f4;
      fStack_2d0 = auVar27._8_4_ * fStack_2f0;
      fStack_2cc = auVar27._12_4_ * fStack_2ec;
      fVar17 = fStack_2d4 - local_2d8;
      local_368 = CONCAT44(fStack_2d4 + -0.5,local_2d8 + -0.5);
      uStack_360 = CONCAT44(fStack_2cc + 0.0,fStack_2d0 + 0.0);
      fVar18 = ceilf(local_2d8 + -0.5);
      fVar19 = ceilf(local_368._4_4_);
      local_328 = (ulong)(iVar12 * uVar11);
      local_330 = (ulong)(uVar14 * uVar11);
      local_320 = 0;
      local_338 = (ulong)uVar14;
      do {
        iVar12 = (int)local_320;
        local_320 = local_320 + 1;
        fVar24 = ((float)iVar12 / (float)local_2e8._0_4_) * (float)iVar1;
        local_378._0_4_ = ((float)(int)local_320 / (float)local_2e8._0_4_) * (float)iVar1;
        fVar20 = ceilf(fVar24 + -0.5);
        fVar21 = ceilf((float)local_378._0_4_ + -0.5);
        local_318 = *(undefined8 *)
                     local_350.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_328 + iVar12].m_data;
        uStack_310 = *(undefined8 *)
                      (local_350.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_328 + iVar12].m_data + 2
                      );
        uVar8 = *(undefined8 *)
                 local_350.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)local_328 + iVar12 + 1].m_data;
        uVar9 = *(undefined8 *)
                 (local_350.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)local_328 + iVar12 + 1].m_data + 2)
        ;
        local_368 = *(undefined8 *)
                     local_350.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_330 + iVar12].m_data;
        uStack_360 = *(undefined8 *)
                      (local_350.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_330 + iVar12].m_data + 2
                      );
        local_2b8 = *(undefined8 *)
                     local_350.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_330 + iVar12 + 1].m_data;
        uStack_2b0 = *(undefined8 *)
                      (local_350.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_330 + iVar12 + 1].m_data
                      + 2);
        if ((int)fVar18 < (int)fVar19) {
          fVar25 = (float)local_378._0_4_ - fVar24;
          iVar12 = (int)fVar18;
          do {
            if ((int)fVar20 < (int)fVar21) {
              fVar28 = (((float)iVar12 + 0.5) - local_2d8) * (1.0 / fVar17);
              fVar29 = 1.0;
              if (fVar28 <= 1.0) {
                fVar29 = fVar28;
              }
              fVar29 = (float)(-(uint)(0.0 < fVar28) & (uint)fVar29);
              local_378 = ZEXT416((uint)fVar29);
              fVar28 = fVar29;
              iVar15 = (int)fVar20;
              do {
                fVar22 = (((float)iVar15 + 0.5) - fVar24) * (1.0 / fVar25);
                fVar23 = 1.0;
                if (fVar22 <= 1.0) {
                  fVar23 = fVar22;
                }
                fVar23 = (float)(-(uint)(0.0 < fVar22) & (uint)fVar23);
                bVar3 = 1.0 < fVar28 + fVar23;
                pfVar10 = (float *)&local_318;
                if (bVar3) {
                  pfVar10 = (float *)&local_2b8;
                }
                local_398 = (float)uVar8;
                fStack_394 = (float)((ulong)uVar8 >> 0x20);
                fStack_390 = (float)uVar9;
                fStack_38c = (float)((ulong)uVar9 >> 0x20);
                fVar22 = (float)local_368;
                fVar30 = local_368._4_4_;
                fVar31 = (float)uStack_360;
                fVar32 = uStack_360._4_4_;
                if (bVar3) {
                  fVar23 = 1.0 - fVar23;
                  fVar22 = local_398;
                  fVar30 = fStack_394;
                  fVar31 = fStack_390;
                  fVar32 = fStack_38c;
                  fVar28 = 1.0 - fVar29;
                  fStack_38c = uStack_360._4_4_;
                  fStack_390 = (float)uStack_360;
                  fStack_394 = local_368._4_4_;
                  local_398 = (float)local_368;
                }
                fVar4 = *pfVar10;
                fVar5 = pfVar10[1];
                fVar6 = pfVar10[2];
                fVar7 = pfVar10[3];
                local_2c8.m_data[0] =
                     fVar28 * (fVar22 - fVar4) + fVar23 * (local_398 - fVar4) + fVar4;
                local_2c8.m_data[1] =
                     fVar28 * (fVar30 - fVar5) + fVar23 * (fStack_394 - fVar5) + fVar5;
                local_2c8.m_data[2] =
                     fVar28 * (fVar31 - fVar6) + fVar23 * (fStack_390 - fVar6) + fVar6;
                local_2c8.m_data[3] =
                     fVar28 * (fVar32 - fVar7) + fVar23 * (fStack_38c - fVar7) + fVar7;
                tcu::RGBA::RGBA(&local_37c,&local_2c8);
                *(deUint32 *)
                 ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar12 + iVar15) * 4) =
                     local_37c.m_value;
                iVar15 = iVar15 + 1;
                fVar28 = (float)local_378._0_4_;
              } while ((int)fVar21 != iVar15);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 != (int)fVar19);
        }
      } while (local_320 != uVar2);
      uVar16 = local_338;
    } while ((uint)local_338 != uVar2);
  }
  if (local_350.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_350.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::computeVertexReference (tcu::Surface& result, const QuadGrid& quadGrid)
{
	DE_ASSERT(m_evaluator);

	// Buffer info.
	const int				width		= result.getWidth();
	const int				height		= result.getHeight();
	const int				gridSize	= quadGrid.getGridSize();
	const int				stride		= gridSize + 1;
	const bool				hasAlpha	= true; // \todo [2015-09-07 elecro] add correct alpha check
	ShaderEvalContext		evalCtx		(quadGrid);

	// Evaluate color for each vertex.
	std::vector<tcu::Vec4>	colors		((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		const float	sx			= (float)x / (float)gridSize;
		const float	sy			= (float)y / (float)gridSize;
		const int	vtxNdx		= ((y * (gridSize+1)) + x);

		evalCtx.reset(sx, sy);
		m_evaluator->evaluate(evalCtx);
		DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
		tcu::Vec4 color = evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		colors[vtxNdx] = color;
	}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		const float		x0		= (float)x       / (float)gridSize;
		const float		x1		= (float)(x + 1) / (float)gridSize;
		const float		y0		= (float)y       / (float)gridSize;
		const float		y1		= (float)(y + 1) / (float)gridSize;

		const float		sx0		= x0 * (float)width;
		const float		sx1		= x1 * (float)width;
		const float		sy0		= y0 * (float)height;
		const float		sy1		= y1 * (float)height;
		const float		oosx	= 1.0f / (sx1 - sx0);
		const float		oosy	= 1.0f / (sy1 - sy0);

		const int		ix0		= deCeilFloatToInt32(sx0 - 0.5f);
		const int		ix1		= deCeilFloatToInt32(sx1 - 0.5f);
		const int		iy0		= deCeilFloatToInt32(sy0 - 0.5f);
		const int		iy1		= deCeilFloatToInt32(sy1 - 0.5f);

		const int		v00		= (y * stride) + x;
		const int		v01		= (y * stride) + x + 1;
		const int		v10		= ((y + 1) * stride) + x;
		const int		v11		= ((y + 1) * stride) + x + 1;
		const tcu::Vec4	c00		= colors[v00];
		const tcu::Vec4	c01		= colors[v01];
		const tcu::Vec4	c10		= colors[v10];
		const tcu::Vec4	c11		= colors[v11];

		//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

		for (int iy = iy0; iy < iy1; iy++)
		for (int ix = ix0; ix < ix1; ix++)
		{
			DE_ASSERT(deInBounds32(ix, 0, width));
			DE_ASSERT(deInBounds32(iy, 0, height));

			const float			sfx		= (float)ix + 0.5f;
			const float			sfy		= (float)iy + 0.5f;
			const float			fx1		= deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
			const float			fy1		= deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

			// Triangle quad interpolation.
			const bool			tri		= fx1 + fy1 <= 1.0f;
			const float			tx		= tri ? fx1 : (1.0f-fx1);
			const float			ty		= tri ? fy1 : (1.0f-fy1);
			const tcu::Vec4&	t0		= tri ? c00 : c11;
			const tcu::Vec4&	t1		= tri ? c01 : c10;
			const tcu::Vec4&	t2		= tri ? c10 : c01;
			const tcu::Vec4		color	= t0 + (t1-t0)*tx + (t2-t0)*ty;

			result.setPixel(ix, iy, tcu::RGBA(color));
		}
	}
}